

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cpp
# Opt level: O2

bool __thiscall Gluco::SimpSolver::eliminate(SimpSolver *this,bool turn_off_elim)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  undefined1 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  undefined7 in_register_00000031;
  lbool local_4a;
  lbool local_49;
  Heap<Gluco::SimpSolver::ElimLt> *local_48;
  int *local_40;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT71(in_register_00000031,turn_off_elim);
  bVar3 = Solver::simplify(&this->super_Solver);
  if (bVar3) {
    uVar4 = 1;
    if (this->use_simplification == true) {
      if ((this->super_Solver).clauses.sz < 0x493e01) {
        local_48 = &this->elim_heap;
        local_40 = &(this->super_Solver).verbosity;
        do {
          if (((this->n_touched < 1) && ((this->super_Solver).trail.sz <= this->bwdsub_assigns)) &&
             ((this->elim_heap).heap.sz < 1)) goto LAB_004baabf;
          gatherTouchedClauses(this);
          iVar6 = (this->subsumption_queue).end;
          iVar9 = 0;
          iVar7 = (this->subsumption_queue).first;
          iVar5 = iVar6 - iVar7;
          if (iVar6 < iVar7) {
            iVar9 = (this->subsumption_queue).buf.sz;
          }
          iVar6 = iVar5 + iVar9;
          if ((iVar6 != 0 && SCARRY4(iVar5,iVar9) == iVar6 < 0) ||
             (this->bwdsub_assigns < (this->super_Solver).trail.sz)) {
            bVar3 = backwardSubsumptionCheck(this,true);
            if (!bVar3) {
LAB_004baa6d:
              (this->super_Solver).ok = false;
              goto LAB_004baabf;
            }
          }
          if ((this->super_Solver).asynch_interrupt != false) {
            if (this->bwdsub_assigns != (this->super_Solver).trail.sz) {
              __assert_fail("bwdsub_assigns == trail.size()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/SimpSolver.cpp"
                            ,0x27d,"bool Gluco::SimpSolver::eliminate(bool)");
            }
            iVar6 = (this->subsumption_queue).end;
            iVar9 = 0;
            iVar7 = (this->subsumption_queue).first;
            if (iVar6 < iVar7) {
              iVar9 = (this->subsumption_queue).buf.sz;
            }
            if ((iVar6 - iVar7) + iVar9 != 0) {
              __assert_fail("subsumption_queue.size() == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/SimpSolver.cpp"
                            ,0x27e,"bool Gluco::SimpSolver::eliminate(bool)");
            }
            if (this->n_touched != 0) {
              __assert_fail("n_touched == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/SimpSolver.cpp"
                            ,0x27f,"bool Gluco::SimpSolver::eliminate(bool)");
            }
            Heap<Gluco::SimpSolver::ElimLt>::clear(local_48,false);
            goto LAB_004baabf;
          }
          iVar6 = 0;
          uVar10 = 0;
          while( true ) {
            if ((this->elim_heap).heap.sz == 0) break;
            iVar7 = Heap<Gluco::SimpSolver::ElimLt>::removeMin(local_48);
            if ((this->super_Solver).asynch_interrupt != false) break;
            if (((this->eliminated).sz < 1) || ((this->eliminated).data[iVar7] == '\0')) {
              local_49.value = (this->super_Solver).assigns.data[iVar7].value;
              bVar3 = lbool::operator!=(&local_49,(lbool)0x2);
              if (!bVar3) {
                if ((1 < *local_40) && ((int)(uVar10 / 100) * 100 + iVar6 == 0)) {
                  printf("elimination left: %10d\r");
                }
                if (this->use_asymm == true) {
                  pcVar2 = (this->frozen).data;
                  cVar1 = pcVar2[iVar7];
                  pcVar2[iVar7] = '\x01';
                  bVar3 = asymmVar(this,iVar7);
                  if (!bVar3) goto LAB_004baa6d;
                  (this->frozen).data[iVar7] = cVar1 != '\0';
                }
                if (this->use_elim == true) {
                  local_4a.value = (this->super_Solver).assigns.data[iVar7].value;
                  bVar3 = lbool::operator==(&local_4a,(lbool)0x2);
                  if ((bVar3) && ((this->frozen).data[iVar7] == '\0')) {
                    bVar3 = eliminateVar(this,iVar7);
                    if (!bVar3) goto LAB_004baa6d;
                  }
                }
                Solver::checkGarbage(&this->super_Solver,this->simp_garbage_frac);
              }
            }
            uVar10 = (ulong)((int)uVar10 + 1);
            iVar6 = iVar6 + -1;
          }
          iVar6 = (this->subsumption_queue).end;
          iVar9 = 0;
          iVar7 = (this->subsumption_queue).first;
          if (iVar6 < iVar7) {
            iVar9 = (this->subsumption_queue).buf.sz;
          }
          if ((iVar6 - iVar7) + iVar9 != 0) {
            __assert_fail("subsumption_queue.size() == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/SimpSolver.cpp"
                          ,0x29e,"bool Gluco::SimpSolver::eliminate(bool)");
          }
        } while( true );
      }
      puts("c Too many clauses... No preprocessing");
      local_48 = &this->elim_heap;
      local_40 = &(this->super_Solver).verbosity;
LAB_004baabf:
      if ((char)local_34 == '\0') {
        cleanUpClauses(this);
        Solver::checkGarbage(&this->super_Solver);
      }
      else {
        vec<char>::clear(&this->touched,true);
        OccLists<int,_Gluco::vec<unsigned_int>,_Gluco::SimpSolver::ClauseDeleted>::clear
                  (&this->occurs,true);
        vec<int>::clear(&this->n_occ,true);
        Heap<Gluco::SimpSolver::ElimLt>::clear(local_48,true);
        Queue<unsigned_int>::clear(&this->subsumption_queue,true);
        this->use_simplification = false;
        (this->super_Solver).remove_satisfied = true;
        (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.field_0x14 = 0;
        Solver::rebuildOrderHeap(&this->super_Solver);
        (*(this->super_Solver)._vptr_Solver[3])(this);
      }
      if ((0 < *local_40) && (lVar8 = (long)(this->elimclauses).sz, 0 < lVar8)) {
        printf("c |  Eliminated clauses:     %10.2f Mb                                                                |\n"
               ,(double)(lVar8 << 2) * 9.5367431640625e-07);
      }
      uVar4 = (this->super_Solver).ok;
    }
  }
  else {
    uVar4 = 0;
  }
  return (bool)uVar4;
}

Assistant:

bool SimpSolver::eliminate(bool turn_off_elim)
{
    //abctime clk = Abc_Clock();
    if (!simplify())
        return false;
    else if (!use_simplification)
        return true;

    // Main simplification loop:
    //

    int toPerform = clauses.size()<=4800000;
    
    if(!toPerform) {
      printf("c Too many clauses... No preprocessing\n");
    }

    while (toPerform && (n_touched > 0 || bwdsub_assigns < trail.size() || elim_heap.size() > 0)){

        gatherTouchedClauses();
        // printf("  ## (time = %6.2f s) BWD-SUB: queue = %d, trail = %d\n", cpuTime(), subsumption_queue.size(), trail.size() - bwdsub_assigns);
        if ((subsumption_queue.size() > 0 || bwdsub_assigns < trail.size()) && 
            !backwardSubsumptionCheck(true)){
            ok = false; goto cleanup; }

        // Empty elim_heap and return immediately on user-interrupt:
        if (asynch_interrupt){
            assert(bwdsub_assigns == trail.size());
            assert(subsumption_queue.size() == 0);
            assert(n_touched == 0);
            elim_heap.clear();
            goto cleanup; }

        // printf("  ## (time = %6.2f s) ELIM: vars = %d\n", cpuTime(), elim_heap.size());
        for (int cnt = 0; !elim_heap.empty(); cnt++){
            Var elim = elim_heap.removeMin();
            
            if (asynch_interrupt) break;

            if (isEliminated(elim) || value(elim) != l_Undef) continue;

            if (verbosity >= 2 && cnt % 100 == 0)
                printf("elimination left: %10d\r", elim_heap.size());

            if (use_asymm){
                // Temporarily freeze variable. Otherwise, it would immediately end up on the queue again:
                bool was_frozen = frozen[elim] != 0;
                frozen[elim] = true;
                if (!asymmVar(elim)){
                    ok = false; goto cleanup; }
                frozen[elim] = was_frozen; }

            // At this point, the variable may have been set by assymetric branching, so check it
            // again. Also, don't eliminate frozen variables:
            if (use_elim && value(elim) == l_Undef && !frozen[elim] && !eliminateVar(elim)){
                ok = false; goto cleanup; }

            checkGarbage(simp_garbage_frac);
        }

        assert(subsumption_queue.size() == 0);
    }
 cleanup:

    // If no more simplification is needed, free all simplification-related data structures:
    if (turn_off_elim){
        touched  .clear(true);
        occurs   .clear(true);
        n_occ    .clear(true);
        elim_heap.clear(true);
        subsumption_queue.clear(true);

        use_simplification    = false;
        remove_satisfied      = true;
        ca.extra_clause_field = false;

        // Force full cleanup (this is safe and desirable since it only happens once):
        rebuildOrderHeap();
        garbageCollect();
    }else{
        // Cheaper cleanup:
        cleanUpClauses(); // TODO: can we make 'cleanUpClauses()' not be linear in the problem size somehow?
        checkGarbage();
    }

    if (verbosity >= 1 && elimclauses.size() > 0)
        printf("c |  Eliminated clauses:     %10.2f Mb                                                                |\n", 
               double(elimclauses.size() * sizeof(uint32_t)) / (1024*1024));
    return ok;
}